

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

int SUNLinSolSetScalingVectors_SPBCGS(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  void *pvVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    pvVar1 = S->content;
    *(N_Vector *)((long)pvVar1 + 0x48) = s1;
    *(N_Vector *)((long)pvVar1 + 0x50) = s2;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLinSolSetScalingVectors_SPBCGS(SUNLinearSolver S, N_Vector s1,
                                      N_Vector s2)
{
  /* set N_Vector pointers to integrator-supplied scaling vectors, 
     and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPBCGS_CONTENT(S)->s1 = s1;
  SPBCGS_CONTENT(S)->s2 = s2;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}